

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O2

void __thiscall World::clean_unused_blocksets(World *this)

{
  pointer ppBVar1;
  pointer pvVar2;
  _Vector_base<std::array<Tile,_4UL>,_std::allocator<std::array<Tile,_4UL>_>_> *this_00;
  Blockset *pBVar3;
  _Base_ptr p_Var4;
  size_type sVar5;
  size_t j;
  ulong uVar6;
  pointer pvVar7;
  vector<Blockset_*,_std::allocator<Blockset_*>_> *blockset_group;
  Blockset *blockset;
  World *local_70;
  pointer local_68;
  set<Blockset_*,_std::less<Blockset_*>,_std::allocator<Blockset_*>_> used_blocksets;
  
  used_blocksets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &used_blocksets._M_t._M_impl.super__Rb_tree_header._M_header;
  used_blocksets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  used_blocksets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  used_blocksets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  used_blocksets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       used_blocksets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var4 = (this->_maps)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->_maps)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    blockset = (Blockset *)(p_Var4[1]._M_parent)->_M_left;
    std::
    _Rb_tree<Blockset*,Blockset*,std::_Identity<Blockset*>,std::less<Blockset*>,std::allocator<Blockset*>>
    ::_M_insert_unique<Blockset*>
              ((_Rb_tree<Blockset*,Blockset*,std::_Identity<Blockset*>,std::less<Blockset*>,std::allocator<Blockset*>>
                *)&used_blocksets,&blockset);
  }
  local_68 = (this->_blockset_groups).
             super__Vector_base<std::vector<Blockset_*,_std::allocator<Blockset_*>_>,_std::allocator<std::vector<Blockset_*,_std::allocator<Blockset_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_70 = this;
  for (pvVar7 = (this->_blockset_groups).
                super__Vector_base<std::vector<Blockset_*,_std::allocator<Blockset_*>_>,_std::allocator<std::vector<Blockset_*,_std::allocator<Blockset_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pvVar7 != local_68; pvVar7 = pvVar7 + 1)
  {
    for (uVar6 = 1;
        ppBVar1 = (pvVar7->super__Vector_base<Blockset_*,_std::allocator<Blockset_*>_>)._M_impl.
                  super__Vector_impl_data._M_start,
        uVar6 < (ulong)((long)(pvVar7->super__Vector_base<Blockset_*,_std::allocator<Blockset_*>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppBVar1 >> 3);
        uVar6 = uVar6 + 1) {
      blockset = ppBVar1[uVar6];
      sVar5 = std::set<Blockset_*,_std::less<Blockset_*>,_std::allocator<Blockset_*>_>::count
                        (&used_blocksets,&blockset);
      if (sVar5 == 0) {
        std::vector<Blockset_*,_std::allocator<Blockset_*>_>::erase
                  (pvVar7,(const_iterator)
                          ((pvVar7->super__Vector_base<Blockset_*,_std::allocator<Blockset_*>_>).
                           _M_impl.super__Vector_impl_data._M_start + (int)uVar6));
        pBVar3 = blockset;
        if (blockset != (Blockset *)0x0) {
          std::_Vector_base<std::array<Tile,_4UL>,_std::allocator<std::array<Tile,_4UL>_>_>::
          ~_Vector_base((_Vector_base<std::array<Tile,_4UL>,_std::allocator<std::array<Tile,_4UL>_>_>
                         *)blockset);
        }
        operator_delete(pBVar3,0x18);
        uVar6 = uVar6 - 1;
      }
    }
  }
  pvVar2 = (local_70->_blockset_groups).
           super__Vector_base<std::vector<Blockset_*,_std::allocator<Blockset_*>_>,_std::allocator<std::vector<Blockset_*,_std::allocator<Blockset_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar7 = (local_70->_blockset_groups).
                super__Vector_base<std::vector<Blockset_*,_std::allocator<Blockset_*>_>,_std::allocator<std::vector<Blockset_*,_std::allocator<Blockset_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pvVar7 != pvVar2; pvVar7 = pvVar7 + 1) {
    ppBVar1 = (pvVar7->super__Vector_base<Blockset_*,_std::allocator<Blockset_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((long)(pvVar7->super__Vector_base<Blockset_*,_std::allocator<Blockset_*>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)ppBVar1 == 8) {
      this_00 = (_Vector_base<std::array<Tile,_4UL>,_std::allocator<std::array<Tile,_4UL>_>_> *)
                *ppBVar1;
      if (this_00 !=
          (_Vector_base<std::array<Tile,_4UL>,_std::allocator<std::array<Tile,_4UL>_>_> *)0x0) {
        std::_Vector_base<std::array<Tile,_4UL>,_std::allocator<std::array<Tile,_4UL>_>_>::
        ~_Vector_base(this_00);
      }
      operator_delete(this_00,0x18);
      ppBVar1 = (pvVar7->super__Vector_base<Blockset_*,_std::allocator<Blockset_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((pvVar7->super__Vector_base<Blockset_*,_std::allocator<Blockset_*>_>)._M_impl.
          super__Vector_impl_data._M_finish != ppBVar1) {
        (pvVar7->super__Vector_base<Blockset_*,_std::allocator<Blockset_*>_>)._M_impl.
        super__Vector_impl_data._M_finish = ppBVar1;
      }
    }
  }
  std::
  _Rb_tree<Blockset_*,_Blockset_*,_std::_Identity<Blockset_*>,_std::less<Blockset_*>,_std::allocator<Blockset_*>_>
  ::~_Rb_tree(&used_blocksets._M_t);
  return;
}

Assistant:

void World::clean_unused_blocksets()
{
    std::set<Blockset*> used_blocksets;
    for(auto& [id, map] : _maps)
        used_blocksets.insert(map->blockset());

    // Iterate over all secondary blocksets, and remove unused ones
    for(auto& blockset_group : _blockset_groups)
    {
        // Only start from one to exclude primary blocksets (which are never directly referenced)
        // Primary blocksets are removed only if all linked secondary blocksets are removed as well
        for(size_t j=1 ; j<blockset_group.size() ; ++j)
        {
            Blockset* blockset = blockset_group[j];
            if(!used_blocksets.count(blockset))
            {
                blockset_group.erase(blockset_group.begin() + (int)j);
                delete blockset;
                --j;
            }
        }
    }

    // Empty eventual blockset groups where only the primary blockset remains (no secondary blockset in the group)
    for(auto& blockset_group : _blockset_groups)
    {
        if(blockset_group.size() == 1)
        {
            delete blockset_group[0];
            blockset_group.clear();
        }
    }
}